

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_quaternion_to_axis_angle(rf_quaternion q,rf_vec3 *outAxis,float *outAngle)

{
  float fVar1;
  double dVar2;
  double dVar3;
  rf_quaternion rVar4;
  float den;
  float resAngle;
  rf_vec3 resAxis;
  float *outAngle_local;
  rf_vec3 *outAxis_local;
  rf_quaternion q_local;
  
  outAxis_local._0_4_ = q.x;
  outAxis_local._4_4_ = q.y;
  q_local.x = q.z;
  q_local.y = q.w;
  if (1.0 < ABS(q_local.y)) {
    rVar4 = rf_quaternion_normalize(q);
    resAxis._4_8_ = rVar4._0_8_;
    outAxis_local._0_4_ = rVar4.x;
    outAxis_local._4_4_ = rVar4.y;
    q_local.x = rVar4.z;
    q_local.y = rVar4.w;
  }
  memset(&den,0,0xc);
  dVar2 = acos((double)q_local.y);
  dVar3 = sqrt((double)(-q_local.y * q_local.y + 1.0));
  fVar1 = (float)dVar3;
  if (fVar1 <= 0.0001) {
    den = 1.0;
  }
  else {
    den = outAxis_local._0_4_ / fVar1;
    resAngle = outAxis_local._4_4_ / fVar1;
    resAxis.x = q_local.x / fVar1;
  }
  outAxis->x = den;
  outAxis->y = resAngle;
  outAxis->z = resAxis.x;
  *outAngle = (float)dVar2 * 2.0;
  return;
}

Assistant:

RF_API void rf_quaternion_to_axis_angle(rf_quaternion q, rf_vec3 *outAxis, float *outAngle)
{
    if (fabs(q.w) > 1.0f) q = rf_quaternion_normalize(q);

    rf_vec3 resAxis = {0.0f, 0.0f, 0.0f};
    float resAngle = 0.0f;

    resAngle = 2.0f * (float) acos(q.w);
    float den = (float) sqrt(1.0f - q.w * q.w);

    if (den > 0.0001f)
    {
        resAxis.x = q.x / den;
        resAxis.y = q.y / den;
        resAxis.z = q.z / den;
    } else
    {
        // This occurs when the angle is zero.
        // Not a problem: just set an arbitrary normalized axis.
        resAxis.x = 1.0f;
    }

    *outAxis = resAxis;
    *outAngle = resAngle;
}